

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O0

size_t __thiscall PClassActor::PropagateMark(PClassActor *this)

{
  size_t sVar1;
  int local_14;
  int i;
  PClassActor *this_local;
  
  for (local_14 = 0; local_14 < this->NumOwnedStates; local_14 = local_14 + 1) {
    if (this->OwnedStates[local_14].ActionFunc != (VMFunction *)0x0) {
      GC::Mark<VMFunction>(&this->OwnedStates[local_14].ActionFunc);
    }
  }
  if ((this->super_PClass).Defaults != (BYTE *)0x0) {
    GC::Mark<VMFunction>((VMFunction **)((this->super_PClass).Defaults + 0x1b0));
  }
  sVar1 = PStruct::PropagateMark((PStruct *)this);
  return sVar1;
}

Assistant:

size_t PClassActor::PropagateMark()
{
	// Mark state functions
	for (int i = 0; i < NumOwnedStates; ++i)
	{
		if (OwnedStates[i].ActionFunc != NULL)
		{
			GC::Mark(OwnedStates[i].ActionFunc);
		}
	}
	// Mark damage function
	if (Defaults != NULL)
	{
		GC::Mark(((AActor *)Defaults)->DamageFunc);
	}

//	marked += ActorInfo->NumOwnedStates * sizeof(FState);
	return Super::PropagateMark();
}